

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libevent-client.c
# Opt level: O1

int on_frame_recv_callback(nghttp2_session *session,nghttp2_frame *frame,void *user_data)

{
  http2_session_data *session_data;
  
  if ((((frame->hd).type == '\x01') && ((frame->headers).cat == NGHTTP2_HCAT_RESPONSE)) &&
     (*(int *)(*(long *)((long)user_data + 0x18) + 0x30) == (frame->hd).stream_id)) {
    on_frame_recv_callback_cold_1();
  }
  return 0;
}

Assistant:

static int on_frame_recv_callback(nghttp2_session *session,
                                  const nghttp2_frame *frame, void *user_data) {
  http2_session_data *session_data = (http2_session_data *)user_data;
  (void)session;

  switch (frame->hd.type) {
  case NGHTTP2_HEADERS:
    if (frame->headers.cat == NGHTTP2_HCAT_RESPONSE &&
        session_data->stream_data->stream_id == frame->hd.stream_id) {
      fprintf(stderr, "All headers received\n");
    }
    break;
  }
  return 0;
}